

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consuming_buffers.hpp
# Opt level: O0

void __thiscall
asio::detail::
consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
::consume(consuming_buffers<asio::const_buffer,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>,___gnu_cxx::__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>_>
          *this,size_t size)

{
  bool bVar1;
  reference pcVar2;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *pvVar3;
  size_t sVar4;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_RSI;
  long in_RDI;
  const_buffer next_buf;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  end;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  next;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  unsigned_long in_stack_ffffffffffffffb8;
  const_buffer *b;
  const_buffer in_stack_ffffffffffffffc0;
  __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
  local_18;
  vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *local_10;
  
  *(long *)(in_RDI + 0x20) =
       (long)&(in_RSI->super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
              _M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x20);
  local_10 = in_RSI;
  buffer_sequence_begin<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>
            (in_stack_ffffffffffffff98,0);
  __gnu_cxx::
  __normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>
  ::__normal_iterator<asio::const_buffer*>
            ((__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
              *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (__normal_iterator<asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
              *)in_stack_ffffffffffffff98);
  buffer_sequence_end<std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>
            (in_stack_ffffffffffffff98,0);
  __gnu_cxx::
  __normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>
  ::__normal_iterator<asio::const_buffer*>
            ((__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
              *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             (__normal_iterator<asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
              *)in_stack_ffffffffffffff98);
  std::
  advance<__gnu_cxx::__normal_iterator<asio::const_buffer_const*,std::vector<asio::const_buffer,std::allocator<asio::const_buffer>>>,unsigned_long>
            ((__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
              *)in_stack_ffffffffffffffc0.data_,in_stack_ffffffffffffffb8);
  while( true ) {
    b = (const_buffer *)in_stack_ffffffffffffffc0.data_;
    bVar1 = __gnu_cxx::
            operator==<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
                      ((__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (__normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
                        *)in_stack_ffffffffffffff98);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    in_stack_ffffffffffffffa7 =
         bVar1 && local_10 != (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x0
    ;
    if (!bVar1 || local_10 == (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x0
       ) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
             ::operator*(&local_18);
    in_stack_ffffffffffffffc0 = operator+(b,pcVar2->size_);
    in_stack_ffffffffffffff98 = local_10;
    pvVar3 = (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
             const_buffer::size((const_buffer *)&stack0xffffffffffffffc0);
    if (in_stack_ffffffffffffff98 < pvVar3) {
      *(long *)(in_RDI + 0x30) =
           (long)&(local_10->
                  super__Vector_base<asio::const_buffer,_std::allocator<asio::const_buffer>_>).
                  _M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x30);
      local_10 = (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)0x0;
    }
    else {
      sVar4 = const_buffer::size((const_buffer *)&stack0xffffffffffffffc0);
      local_10 = (vector<asio::const_buffer,_std::allocator<asio::const_buffer>_> *)
                 ((long)local_10 - sVar4);
      *(undefined8 *)(in_RDI + 0x30) = 0;
      *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
      __gnu_cxx::
      __normal_iterator<const_asio::const_buffer_*,_std::vector<asio::const_buffer,_std::allocator<asio::const_buffer>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void consume(std::size_t size)
  {
    total_consumed_ += size;

    Buffer_Iterator next = asio::buffer_sequence_begin(buffers_);
    Buffer_Iterator end = asio::buffer_sequence_end(buffers_);

    std::advance(next, next_elem_);
    while (next != end && size > 0)
    {
      Buffer next_buf = Buffer(*next) + next_elem_offset_;
      if (size < next_buf.size())
      {
        next_elem_offset_ += size;
        size = 0;
      }
      else
      {
        size -= next_buf.size();
        next_elem_offset_ = 0;
        ++next_elem_;
        ++next;
      }
    }
  }